

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O1

char * cft_args_get_autotune_metric_label(fasttext_args_t *handle)

{
  char *pcVar1;
  string local_30;
  
  fasttext::Args::getAutotuneMetricLabel_abi_cxx11_(&local_30,(Args *)handle);
  pcVar1 = strdup(local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return pcVar1;
}

Assistant:

const char* cft_args_get_autotune_metric_label(fasttext_args_t *handle) {
    return strdup(((Args*)handle)->getAutotuneMetricLabel().c_str());
}